

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int * Gia_ManDeriveNexts(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  int local_24;
  int i;
  uint *pTails;
  uint *pNexts;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x108,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  if (p->pNexts != (int *)0x0) {
    __assert_fail("p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x109,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  piVar2 = (int *)calloc((long)iVar1,4);
  iVar1 = Gia_ManObjNum(p);
  __ptr = malloc((long)iVar1 << 2);
  for (local_24 = 0; iVar1 = Gia_ManObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    *(int *)((long)__ptr + (long)local_24 * 4) = local_24;
  }
  for (local_24 = 0; iVar1 = Gia_ManObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    if ((((uint)p->pReprs[local_24] & 0xfffffff) != 0) &&
       (((uint)p->pReprs[local_24] & 0xfffffff) != 0xfffffff)) {
      piVar2[*(uint *)((long)__ptr + (ulong)((uint)p->pReprs[local_24] & 0xfffffff) * 4)] = local_24
      ;
      *(int *)((long)__ptr + (ulong)((uint)p->pReprs[local_24] & 0xfffffff) * 4) = local_24;
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return piVar2;
}

Assistant:

int * Gia_ManDeriveNexts( Gia_Man_t * p )
{
    unsigned * pNexts, * pTails;
    int i;
    assert( p->pReprs != NULL );
    assert( p->pNexts == NULL );
    pNexts = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    pTails = ABC_ALLOC( unsigned, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pTails[i] = i;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( !p->pReprs[i].iRepr || p->pReprs[i].iRepr == GIA_VOID )
            continue;
        pNexts[ pTails[p->pReprs[i].iRepr] ] = i;
        pTails[p->pReprs[i].iRepr] = i;
    }
    ABC_FREE( pTails );
    return (int *)pNexts;
}